

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O0

void __thiscall
QSocketNotifier::QSocketNotifier(QSocketNotifier *this,qintptr socket,Type type,QObject *parent)

{
  bool bVar1;
  QSocketNotifierPrivate *pQVar2;
  Type pQVar3;
  QSocketNotifier *in_RCX;
  DescriptorType in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  Type thisThreadData;
  QSocketNotifierPrivate *d;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  QMessageLogger *in_stack_ffffffffffffff70;
  QObject *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  QMessageLogger local_50;
  QMessageLogger local_30;
  QSocketDescriptor local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QSocketNotifier(in_RCX,(Type)((ulong)in_stack_ffffffffffffff88 >> 0x20),in_stack_ffffffffffffff80)
  ;
  pQVar2 = d_func((QSocketNotifier *)0x427d61);
  QSocketDescriptor::QSocketDescriptor(&local_c,in_ESI);
  (pQVar2->sockfd).sockfd = local_c.sockfd;
  pQVar2->snenabled = true;
  QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x427da3);
  bVar1 = QSocketDescriptor::isValid((QSocketDescriptor *)in_stack_ffffffffffffff70);
  if (bVar1) {
    bVar1 = QThreadData::hasEventDispatcher((QThreadData *)0x427e12);
    if (bVar1) {
      pQVar3 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                         ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x427e5a);
      (*(pQVar3->super_QObject)._vptr_QObject[0xd])(pQVar3,in_RDI);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff70,in_RDI,CONCAT13(bVar1,(int3)in_stack_ffffffffffffff64),
                 in_stack_ffffffffffffff58);
      QMessageLogger::warning
                (&local_50,"QSocketNotifier: Can only be used with threads started with QThread");
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff70,in_RDI,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58)
    ;
    QMessageLogger::warning(&local_30,"QSocketNotifier: Invalid socket specified");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSocketNotifier::QSocketNotifier(qintptr socket, Type type, QObject *parent)
    : QSocketNotifier(type, parent)
{
    Q_D(QSocketNotifier);

    d->sockfd = socket;
    d->snenabled = true;

    auto thisThreadData = d->threadData.loadRelaxed();

    if (!d->sockfd.isValid())
        qWarning("QSocketNotifier: Invalid socket specified");
    else if (!thisThreadData->hasEventDispatcher())
        qWarning("QSocketNotifier: Can only be used with threads started with QThread");
    else
        thisThreadData->eventDispatcher.loadRelaxed()->registerSocketNotifier(this);
}